

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O1

uint8_t * __thiscall
FastPForLib::VByte::decodeFromByteArray
          (VByte *this,uint8_t *inbyte,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint32_t *puVar4;
  size_t sVar5;
  uint uVar6;
  byte *pbVar7;
  uint32_t uVar8;
  
  if (length == 0) {
    sVar5 = 0;
  }
  else {
    pbVar2 = inbyte + length;
    puVar4 = out;
    if (5 < (long)length) {
      pbVar7 = inbyte + 5;
      do {
        uVar8 = *inbyte & 0x7f;
        if ((char)*inbyte < '\0') {
          uVar8 = uVar8 | (inbyte[1] & 0x7f) << 7;
          if ((char)inbyte[1] < '\0') {
            uVar8 = uVar8 | (inbyte[2] & 0x7f) << 0xe;
            if ((char)inbyte[2] < '\0') {
              pbVar1 = inbyte + 3;
              uVar8 = uVar8 | (*pbVar1 & 0x7f) << 0x15;
              inbyte = inbyte + 4;
              if ((char)*pbVar1 < '\0') {
                uVar8 = uVar8 | (uint)*inbyte << 0x1c;
                inbyte = pbVar7;
              }
            }
            else {
              inbyte = inbyte + 3;
            }
          }
          else {
            inbyte = inbyte + 2;
          }
        }
        else {
          inbyte = inbyte + 1;
        }
        *puVar4 = uVar8;
        puVar4 = puVar4 + 1;
        pbVar7 = inbyte + 5;
      } while (pbVar7 < pbVar2);
    }
    if (inbyte < pbVar2) {
      uVar8 = 0;
      uVar6 = 0;
      pbVar7 = inbyte;
      do {
        while( true ) {
          inbyte = pbVar7 + 1;
          bVar3 = *pbVar7;
          uVar8 = ((bVar3 & 0x7f) << (uVar6 & 0x1f)) + uVar8;
          if (-1 < (char)bVar3) {
            *puVar4 = uVar8;
            puVar4 = puVar4 + 1;
          }
          pbVar7 = inbyte;
          if (pbVar2 <= inbyte || -1 < (char)bVar3) break;
          uVar6 = uVar6 + 7;
        }
        uVar8 = 0;
        uVar6 = 0;
      } while (inbyte < pbVar2);
    }
    sVar5 = (long)puVar4 - (long)out >> 2;
  }
  *nvalue = sVar5;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     uint32_t *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const uint32_t *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 5) {
      uint8_t c;
      uint32_t v;

      c = inbyte[0];
      v = c & 0x7F;
      if (c < 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c < 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c < 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c < 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      inbyte += 5;
      v |= (c & 0x0F) << 28;
      *out++ = v;
    }
    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (uint32_t v = 0; endbyte > inbyte; shift += 7) {
        uint8_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c < 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }